

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_userdata.cpp
# Opt level: O3

ON_UserData * __thiscall ON_UserData::operator=(ON_UserData *this,ON_UserData *src)

{
  uint uVar1;
  long lVar2;
  ON_Xform *pOVar3;
  ON_Xform *pOVar4;
  byte bVar5;
  
  bVar5 = 0;
  if (this != src) {
    ON_Object::operator=(&this->super_ON_Object,&src->super_ON_Object);
    uVar1 = src->m_userdata_copycount;
    this->m_userdata_copycount = uVar1;
    pOVar3 = &src->m_userdata_xform;
    pOVar4 = &this->m_userdata_xform;
    for (lVar2 = 0x10; lVar2 != 0; lVar2 = lVar2 + -1) {
      pOVar4->m_xform[0][0] = pOVar3->m_xform[0][0];
      pOVar3 = (ON_Xform *)((long)pOVar3 + (ulong)bVar5 * -0x10 + 8);
      pOVar4 = (ON_Xform *)((long)pOVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    if (uVar1 != 0) {
      this->m_userdata_copycount = uVar1 + 1 + (uint)(uVar1 == 0xffffffff);
    }
  }
  return this;
}

Assistant:

ON_UserData& ON_UserData::operator=(const ON_UserData& src)
{
  // 16 January 2004 Dale Lear
  //    Do not copy the m_userdata_uuid, m_application_uuid,
  //    m_userdata_owner, or m_userdata_next values.
  //    The m_userdata_uuid and m_application_uuid are
  //    set when the class is constructed and should not be 
  //    changed.  The m_userdata_owner and m_userdata_next
  //    values are set when the user data is attached
  //    to a parent object.
  if ( this != &src ) 
  {
    ON_Object::operator=(src);
    m_userdata_copycount = src.m_userdata_copycount;
    m_userdata_xform = src.m_userdata_xform;
    if ( 0 != m_userdata_copycount )
    {
      m_userdata_copycount++;
      if ( !m_userdata_copycount )
        m_userdata_copycount = 1;
    }
  }

  return *this;
}